

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  undefined4 uVar2;
  int mplsOffset;
  bool bVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  ostream *poVar9;
  char *pcVar10;
  reference __rhs;
  MPLSPlayItem *pMVar11;
  string *psVar12;
  reference pvVar13;
  size_type sVar14;
  reference pvVar15;
  long lVar16;
  runtime_error *prVar17;
  int64_t iVar18;
  VodCoreException *pVVar19;
  AbstractMuxer *pAVar20;
  IsoWriter *this;
  size_t sVar21;
  ulong uVar22;
  PIDListMap *pidList;
  rep rVar23;
  undefined1 auVar24 [16];
  TSMuxer *local_1428;
  TSMuxer *local_1418;
  int *local_1408;
  bool local_137f;
  runtime_error *e;
  VodCoreException *e_1;
  BitStreamException *e_2;
  duration<long,_std::ratio<60L,_1L>_> local_11f0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<60L>_>_> minutes;
  __enable_if_is_duration<std::chrono::duration<long>_> seconds;
  type totalTime;
  time_point endTime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  allocator<char> local_1181;
  string local_1180;
  undefined1 local_1160 [8];
  string dstFile_1;
  string local_1138;
  ostringstream local_1118 [8];
  ostringstream ss_1;
  allocator<char> local_f99;
  string local_f98;
  undefined1 local_f78 [8];
  MuxerManager sMuxer;
  string local_c80;
  string local_c60;
  double *local_c40;
  double *i_2;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  string local_c00;
  int32_t local_bdc;
  undefined1 local_bd8 [4];
  int ssifNum;
  string file2;
  string file1;
  size_t i_1;
  IsoWriter *IsoWriter;
  TSMuxer *subMuxer;
  TSMuxer *mainMuxer;
  string local_b70;
  ostringstream local_b50 [8];
  ostringstream ss;
  string local_9d8;
  undefined1 local_9b2;
  allocator<char> local_9b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_96a;
  allocator<char> local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  allocator<char> local_921;
  string local_920;
  undefined1 local_900 [8];
  string dstFile;
  string local_8d8;
  undefined1 local_8b8 [8];
  MuxerManager muxerManager;
  BlurayHelper blurayHelper;
  undefined1 local_588 [7];
  bool muxMode;
  string fileExt2;
  undefined1 local_560 [4];
  DiskType dt;
  string isoDiskLabel;
  undefined1 local_538 [7];
  bool stereoMode;
  vector<double,_std::allocator<double>_> customChapterList;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_518;
  int autoChapterLen;
  time_point startTime;
  allocator<char> local_4e9;
  string local_4e8;
  undefined1 local_4c8 [8];
  string fileExt;
  uint64_t time;
  PlayListMark *curMark;
  undefined1 local_470 [4];
  int marksPerFile;
  MPLSPlayItem *local_450;
  string local_448;
  string local_428;
  allocator<char> local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360 [8];
  string itemName_1;
  MPLSPlayItem *item_1;
  size_t i;
  int64_t prevFileOffset;
  size_t markIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string ssifName;
  undefined1 local_258 [8];
  string subItemName;
  undefined1 local_218 [8];
  string itemName;
  MPLSPlayItem *item;
  undefined1 local_1e8 [5];
  bool switchToSsif;
  bool mode3D;
  string ssifExt;
  undefined1 local_1c0 [8];
  string mediaExt;
  string local_198;
  undefined1 local_178 [8];
  string streamDir;
  MPLSParser mplsParser;
  undefined1 local_a0 [7];
  bool shortExt;
  undefined1 local_80 [8];
  string fileExt_1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string str;
  int iStack_20;
  bool insertBlankPL;
  int blankNum;
  int firstM2tsOffset;
  int firstMplsOffset;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _firstM2tsOffset = argv;
  argv_local._0_4_ = argc;
  poVar9 = std::operator<<((ostream *)&std::cout,"tsMuxeR version git-c6b1186");
  poVar9 = std::operator<<(poVar9,". github.com/justdan96/tsMuxer");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  sLastMsg = true;
  blankNum = 0;
  iStack_20 = 0;
  str.field_2._12_4_ = 0x76c;
  str.field_2._M_local_buf[0xb] = '\0';
  if ((int)argv_local == 2) {
    pcVar10 = _firstM2tsOffset[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcVar10,&local_49);
    std::allocator<char>::~allocator(&local_49);
    extractFileExt((string *)local_80,(string *)local_48);
    strToLowerCase((string *)local_a0,(string *)local_80);
    std::__cxx11::string::operator=((string *)local_80,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"mpls");
    if ((bVar3) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"mpl"), bVar3)) {
      mplsParser.m_mvcFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,"mpl");
      MPLSParser::MPLSParser((MPLSParser *)((long)&streamDir.field_2 + 8));
      MPLSParser::parse((MPLSParser *)((long)&streamDir.field_2 + 8),_firstM2tsOffset[1]);
      pcVar10 = _firstM2tsOffset[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,pcVar10,
                 (allocator<char> *)(mediaExt.field_2._M_local_buf + 0xf));
      getBlurayStreamDir((string *)local_178,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)(mediaExt.field_2._M_local_buf + 0xf));
      pcVar10 = ".m2ts";
      if ((mplsParser.m_mvcFiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        pcVar10 = ".MTS";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c0,pcVar10,(allocator<char> *)(ssifExt.field_2._M_local_buf + 0xf)
                );
      std::allocator<char>::~allocator((allocator<char> *)(ssifExt.field_2._M_local_buf + 0xf));
      pcVar10 = ".ssif";
      if ((mplsParser.m_mvcFiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        pcVar10 = ".SIF";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,pcVar10,(allocator<char> *)((long)&item + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&item + 7));
      item._6_1_ = mplsParser.m_marks.
                   super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_1_ & 1;
      item._5_1_ = 0;
      bVar3 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::empty
                        ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&mplsParser.IN_time)
      ;
      if (!bVar3) {
        itemName.field_2._8_8_ =
             std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&mplsParser.IN_time,0
                       );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subItemName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,&((reference)itemName.field_2._8_8_)->fileName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&subItemName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0);
        std::__cxx11::string::~string((string *)(subItemName.field_2._M_local_buf + 8));
        bVar3 = fileExists((string *)local_218);
        if (bVar3) {
          if (((item._6_1_ & 1) != 0) &&
             (bVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&mplsParser.number_of_secondary_audio_stream_entries), !bVar3)) {
            __rhs = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&mplsParser.number_of_secondary_audio_stream_entries,0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&ssifName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&ssifName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c0);
            std::__cxx11::string::~string((string *)(ssifName.field_2._M_local_buf + 8));
            bVar3 = fileExists((string *)local_258);
            if (bVar3) {
              pcVar10 = (char *)std::__cxx11::string::c_str();
              detectStreamReader(pcVar10,(MPLSParser *)((long)&streamDir.field_2 + 8),true);
            }
            else {
              item._5_1_ = 1;
            }
            std::__cxx11::string::~string((string *)local_258);
          }
        }
        else {
          item._5_1_ = 1;
        }
        if ((item._5_1_ & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,"SSIF",(allocator<char> *)((long)&markIndex + 7));
          std::operator+(&local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178,&local_318);
          cVar4 = getDirSeparator();
          std::operator+(&local_2d8,&local_2f8,cVar4);
          std::operator+(&local_2b8,&local_2d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (itemName.field_2._8_8_ + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          std::allocator<char>::~allocator((allocator<char> *)((long)&markIndex + 7));
          bVar3 = fileExists((string *)local_298);
          if (bVar3) {
            std::__cxx11::string::operator=((string *)local_218,(string *)local_298);
          }
          std::__cxx11::string::~string((string *)local_298);
        }
        pcVar10 = (char *)std::__cxx11::string::c_str();
        detectStreamReader(pcVar10,(MPLSParser *)((long)&streamDir.field_2 + 8),false);
        std::__cxx11::string::~string((string *)local_218);
      }
      prevFileOffset = 0;
      i = 0;
      for (item_1 = (MPLSPlayItem *)0x0;
          pMVar11 = (MPLSPlayItem *)
                    std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::size
                              ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                               &mplsParser.IN_time), item_1 < pMVar11;
          item_1 = (MPLSPlayItem *)((long)&item_1->IN_time + 1)) {
        itemName_1.field_2._8_8_ =
             std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&mplsParser.IN_time,
                        (size_type)item_1);
        std::__cxx11::string::string(local_360);
        if ((item._6_1_ & 1) == 0) {
          psVar12 = (string *)std::__cxx11::string::append((string *)local_178);
          psVar12 = (string *)std::__cxx11::string::append(psVar12);
          std::__cxx11::string::operator=(local_360,psVar12);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"SSIF",&local_401)
          ;
          std::operator+(&local_3e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_178,&local_400);
          cVar4 = getDirSeparator();
          std::operator+(&local_3c0,&local_3e0,cVar4);
          std::operator+(&local_3a0,&local_3c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (itemName_1.field_2._8_8_ + 8));
          std::operator+(&local_380,&local_3a0,".ssif");
          std::__cxx11::string::operator=(local_360,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
        }
        poVar9 = std::operator<<((ostream *)&std::cout,"");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        poVar9 = std::operator<<((ostream *)&std::cout,"File #");
        local_450 = item_1;
        int64ToStr_abi_cxx11_(&local_448,(int64_t *)&local_450);
        strPadLeft(&local_428,&local_448,5,'0');
        poVar9 = std::operator<<(poVar9,(string *)&local_428);
        poVar9 = std::operator<<(poVar9," name=");
        poVar9 = std::operator<<(poVar9,local_360);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        sLastMsg = true;
        poVar9 = std::operator<<((ostream *)&std::cout,"Duration: ");
        pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                             &mplsParser.IN_time,(size_type)item_1);
        uVar1 = pvVar13->OUT_time;
        pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                             &mplsParser.IN_time,(size_type)item_1);
        floatToTime_abi_cxx11_((string *)local_470,(double)(uVar1 - pvVar13->IN_time) / 45000.0,'.')
        ;
        poVar9 = std::operator<<(poVar9,(string *)local_470);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_470);
        sLastMsg = true;
        if ((mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ & 1) != 0) {
          if ((mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
            poVar9 = std::operator<<((ostream *)&std::cout,"Base view: left-eye");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cout,"Base view: right-eye");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
        }
        sLastMsg = true;
        bVar3 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::empty
                          ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                           &mplsParser.IN_time);
        if (!bVar3) {
          poVar9 = std::operator<<((ostream *)&std::cout,"start-time: ");
          pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                              ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                               &mplsParser.IN_time,0);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,pvVar13->IN_time);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          sLastMsg = true;
        }
        curMark._4_4_ = 0;
        while ((sVar14 = std::vector<PlayListMark,_std::allocator<PlayListMark>_>::size
                                   ((vector<PlayListMark,_std::allocator<PlayListMark>_> *)
                                    &mplsParser.m_streamInfoMVC.
                                     super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
               (ulong)prevFileOffset < sVar14 &&
               (pvVar15 = std::vector<PlayListMark,_std::allocator<PlayListMark>_>::operator[]
                                    ((vector<PlayListMark,_std::allocator<PlayListMark>_> *)
                                     &mplsParser.m_streamInfoMVC.
                                      super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     prevFileOffset),
               (MPLSPlayItem *)(ulong)(uint)pvVar15->m_playItemID <= item_1))) {
          uVar1 = pvVar15->m_markTime;
          pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                              ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                               &mplsParser.IN_time,(size_type)item_1);
          lVar16 = (uVar1 - pvVar13->IN_time) + i;
          if (curMark._4_4_ % 5 == 0) {
            if (0 < curMark._4_4_) {
              poVar9 = std::operator<<((ostream *)&std::cout,"");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              sLastMsg = true;
            }
            std::operator<<((ostream *)&std::cout,"Marks: ");
            sLastMsg = true;
          }
          curMark._4_4_ = curMark._4_4_ + 1;
          auVar24._8_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar24._0_8_ = lVar16;
          auVar24._12_4_ = 0x45300000;
          floatToTime_abi_cxx11_
                    ((string *)((long)&fileExt.field_2 + 8),
                     ((auVar24._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) / 45000.0,'.')
          ;
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   (string *)(fileExt.field_2._M_local_buf + 8));
          std::operator<<(poVar9," ");
          std::__cxx11::string::~string((string *)(fileExt.field_2._M_local_buf + 8));
          sLastMsg = true;
          prevFileOffset = prevFileOffset + 1;
        }
        if (0 < curMark._4_4_) {
          poVar9 = std::operator<<((ostream *)&std::cout,"");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          sLastMsg = true;
        }
        pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                             &mplsParser.IN_time,(size_type)item_1);
        uVar1 = pvVar13->OUT_time;
        pvVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)
                             &mplsParser.IN_time,(size_type)item_1);
        i = (uVar1 - pvVar13->IN_time) + i;
        std::__cxx11::string::~string(local_360);
      }
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::string::~string((string *)local_178);
      MPLSParser::~MPLSParser((MPLSParser *)((long)&streamDir.field_2 + 8));
    }
    else {
      detectStreamReader(_firstM2tsOffset[1],(MPLSParser *)0x0,false);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_48);
  }
  else if ((int)argv_local == 3) {
    pcVar10 = _firstM2tsOffset[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,pcVar10,&local_4e9);
    extractFileExt((string *)local_4c8,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    strToUpperCase((string *)&startTime,(string *)local_4c8);
    std::__cxx11::string::operator=((string *)local_4c8,(string *)&startTime);
    std::__cxx11::string::~string((string *)&startTime);
    tStack_518.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_538);
    isoDiskLabel.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_560);
    fileExt2.field_2._12_4_ =
         checkBluRayMux(_firstM2tsOffset[1],
                        (int *)((long)&customChapterList.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage + 4),
                        (vector<double,_std::allocator<double>_> *)local_538,&blankNum,
                        &stack0xffffffffffffffe0,(bool *)(str.field_2._M_local_buf + 0xb),
                        (int *)(str.field_2._M_local_buf + 0xc),
                        (bool *)(isoDiskLabel.field_2._M_local_buf + 0xf),(string *)local_560);
    unquoteStr((string *)local_588,(string *)local_4c8);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_588,"M2TS");
    bVar3 = true;
    if (!bVar5) {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_588,"TS");
      bVar3 = true;
      if (!bVar5) {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_588,"SSIF");
        bVar3 = true;
        if (!bVar5) {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_588,"ISO");
          bVar3 = true;
          if (!bVar5) {
            bVar3 = fileExt2.field_2._12_4_ != 0;
          }
        }
      }
    }
    if (bVar3) {
      BlurayHelper::BlurayHelper((BlurayHelper *)&muxerManager.m_extraIsoBlocks);
      MuxerManager::MuxerManager
                ((MuxerManager *)local_8b8,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory);
      local_137f = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_588,"SSIF");
      local_137f = local_137f || fileExt2.field_2._12_4_ != 0;
      MuxerManager::setAllowStereoMux((MuxerManager *)local_8b8,local_137f);
      pcVar10 = _firstM2tsOffset[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8d8,pcVar10,
                 (allocator<char> *)(dstFile.field_2._M_local_buf + 0xf));
      MuxerManager::openMetaFile((MuxerManager *)local_8b8,&local_8d8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)(dstFile.field_2._M_local_buf + 0xf));
      bVar5 = isV3();
      if (((!bVar5) && (fileExt2.field_2._12_4_ == 1)) &&
         (bVar5 = MuxerManager::getHevcFound((MuxerManager *)local_8b8), bVar5)) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "HEVC stream detected: changing Blu-Ray version to V3.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
        V3_flags = V3_flags | 1;
      }
      pcVar10 = _firstM2tsOffset[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,pcVar10,&local_921);
      unquoteStr((string *)local_900,&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      std::allocator<char>::~allocator(&local_921);
      bVar5 = isValidFileName((string *)local_900);
      uVar2 = fileExt2.field_2._12_4_;
      if (!bVar5) {
        local_96a = 1;
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_968,"Output filename is invalid: ",&local_969);
        std::operator+(&local_948,&local_968,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_900);
        std::runtime_error::runtime_error(prVar17,(string *)&local_948);
        local_96a = 0;
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (fileExt2.field_2._12_4_ != 0) {
        iVar18 = MuxerManager::totalSize((MuxerManager *)local_8b8);
        uVar6 = MuxerManager::getExtraISOBlocks((MuxerManager *)local_8b8);
        bVar5 = MuxerManager::useReproducibleIsoHeader((MuxerManager *)local_8b8);
        uVar6 = BlurayHelper::open((BlurayHelper *)&muxerManager.m_extraIsoBlocks,local_900,uVar2,
                                   iVar18,(ulong)uVar6,(ulong)bVar5);
        if ((uVar6 & 1) == 0) {
          local_9b2 = 1;
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9b0,"Can\'t create output file ",&local_9b1);
          std::operator+(&local_990,&local_9b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_900);
          std::runtime_error::runtime_error(prVar17,(string *)&local_990);
          local_9b2 = 0;
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        BlurayHelper::setVolumeLabel
                  ((BlurayHelper *)&muxerManager.m_extraIsoBlocks,(string *)local_560);
        BlurayHelper::createBluRayDirs((BlurayHelper *)&muxerManager.m_extraIsoBlocks);
        BlurayHelper::m2tsFileName_abi_cxx11_
                  (&local_9d8,(BlurayHelper *)&muxerManager.m_extraIsoBlocks,iStack_20);
        std::__cxx11::string::operator=((string *)local_900,(string *)&local_9d8);
        std::__cxx11::string::~string((string *)&local_9d8);
      }
      iVar7 = MuxerManager::getTrackCnt((MuxerManager *)local_8b8);
      if (iVar7 == 0) {
        std::__cxx11::ostringstream::ostringstream(local_b50);
        std::operator<<((ostream *)local_b50,"No tracks selected");
        pVVar19 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar19,3,&local_b70);
        __cxa_throw(pVVar19,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      if (fileExt2.field_2._12_4_ == 0) {
        local_1408 = (int *)0x0;
      }
      else {
        local_1408 = &muxerManager.m_extraIsoBlocks;
      }
      MuxerManager::doMux((MuxerManager *)local_8b8,(string *)local_900,(FileFactory *)local_1408);
      if (fileExt2.field_2._12_4_ != 0) {
        BlurayHelper::writeBluRayFiles
                  ((BlurayHelper *)&muxerManager.m_extraIsoBlocks,(MuxerManager *)local_8b8,
                   (bool)(str.field_2._M_local_buf[0xb] & 1),blankNum,str.field_2._12_4_,
                   (bool)(isoDiskLabel.field_2._M_local_buf[0xf] & 1));
        pAVar20 = MuxerManager::getMainMuxer((MuxerManager *)local_8b8);
        if (pAVar20 == (AbstractMuxer *)0x0) {
          local_1418 = (TSMuxer *)0x0;
        }
        else {
          local_1418 = (TSMuxer *)
                       __dynamic_cast(pAVar20,&AbstractMuxer::typeinfo,&TSMuxer::typeinfo);
        }
        pAVar20 = MuxerManager::getSubMuxer((MuxerManager *)local_8b8);
        if (pAVar20 == (AbstractMuxer *)0x0) {
          local_1428 = (TSMuxer *)0x0;
        }
        else {
          local_1428 = (TSMuxer *)
                       __dynamic_cast(pAVar20,&AbstractMuxer::typeinfo,&TSMuxer::typeinfo);
        }
        if (local_1418 != (TSMuxer *)0x0) {
          iVar7 = TSMuxer::getFirstFileNum(local_1418);
          BlurayHelper::createCLPIFile
                    ((BlurayHelper *)&muxerManager.m_extraIsoBlocks,local_1418,iVar7,true);
        }
        if (local_1428 != (TSMuxer *)0x0) {
          iVar7 = TSMuxer::getFirstFileNum(local_1428);
          BlurayHelper::createCLPIFile
                    ((BlurayHelper *)&muxerManager.m_extraIsoBlocks,local_1428,iVar7,false);
          this = BlurayHelper::isoWriter((BlurayHelper *)&muxerManager.m_extraIsoBlocks);
          if (this != (IsoWriter *)0x0) {
            for (file1.field_2._8_8_ = 0; sVar21 = TSMuxer::splitFileCnt(local_1418),
                (ulong)file1.field_2._8_8_ < sVar21; file1.field_2._8_8_ = file1.field_2._8_8_ + 1)
            {
              TSMuxer::getFileNameByIdx_abi_cxx11_
                        ((string *)((long)&file2.field_2 + 8),local_1418,file1.field_2._8_8_);
              TSMuxer::getFileNameByIdx_abi_cxx11_
                        ((string *)local_bd8,local_1428,file1.field_2._8_8_);
              extractFileName(&local_c00,(string *)((long)&file2.field_2 + 8));
              iVar8 = strToInt32(&local_c00);
              std::__cxx11::string::~string((string *)&local_c00);
              local_bdc = iVar8;
              uVar22 = std::__cxx11::string::empty();
              if (((uVar22 & 1) == 0) && (uVar22 = std::__cxx11::string::empty(), (uVar22 & 1) == 0)
                 ) {
                BlurayHelper::ssifFileName_abi_cxx11_
                          ((string *)&__range3,(BlurayHelper *)&muxerManager.m_extraIsoBlocks,
                           local_bdc);
                ::IsoWriter::createInterleavedFile
                          (this,(string *)((long)&file2.field_2 + 8),(string *)local_bd8,
                           (string *)&__range3);
                std::__cxx11::string::~string((string *)&__range3);
              }
              std::__cxx11::string::~string((string *)local_bd8);
              std::__cxx11::string::~string((string *)(file2.field_2._M_local_buf + 8));
            }
          }
        }
        __end3 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_538);
        i_2 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)local_538);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                           *)&i_2), bVar5) {
          local_c40 = __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator*(&__end3);
          iVar18 = MuxerManager::getCutStart((MuxerManager *)local_8b8);
          *local_c40 = *local_c40 - (double)iVar18 / 5292000000.0;
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&__end3);
        }
        if (local_1428 != (TSMuxer *)0x0) {
          TSMuxer::alignPTS(local_1418,local_1428);
        }
        mplsOffset = blankNum;
        iVar7 = customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
        uVar2 = fileExt2.field_2._12_4_;
        bVar5 = MuxerManager::isMvcBaseViewR((MuxerManager *)local_8b8);
        BlurayHelper::createMPLSFile
                  ((BlurayHelper *)&muxerManager.m_extraIsoBlocks,local_1418,local_1428,iVar7,
                   (vector<double,_std::allocator<double>_> *)local_538,uVar2,mplsOffset,bVar5);
        if ((((str.field_2._M_local_buf[0xb] & 1U) != 0) && (local_1418 != (TSMuxer *)0x0)) &&
           (local_1428 == (TSMuxer *)0x0)) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Adding blank play list");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          sLastMsg = true;
          pcVar10 = *_firstM2tsOffset;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c80,pcVar10,(allocator<char> *)&sMuxer.field_0x2ef);
          extractFileDir(&local_c60,&local_c80);
          pidList = TSMuxer::getPidList(local_1418);
          muxBlankPL(&local_c60,(BlurayHelper *)&muxerManager.m_extraIsoBlocks,pidList,
                     fileExt2.field_2._12_4_,str.field_2._12_4_);
          std::__cxx11::string::~string((string *)&local_c60);
          std::__cxx11::string::~string((string *)&local_c80);
          std::allocator<char>::~allocator((allocator<char> *)&sMuxer.field_0x2ef);
        }
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"Mux successful complete");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      std::__cxx11::string::~string((string *)local_900);
      MuxerManager::~MuxerManager((MuxerManager *)local_8b8);
      BlurayHelper::~BlurayHelper((BlurayHelper *)&muxerManager.m_extraIsoBlocks);
    }
    else {
      MuxerManager::MuxerManager
                ((MuxerManager *)local_f78,&readManager,
                 &singleFileMuxerFactory.super_AbstractMuxerFactory);
      pcVar10 = _firstM2tsOffset[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f98,pcVar10,&local_f99);
      MuxerManager::openMetaFile((MuxerManager *)local_f78,&local_f98);
      std::__cxx11::string::~string((string *)&local_f98);
      std::allocator<char>::~allocator(&local_f99);
      iVar7 = MuxerManager::getTrackCnt((MuxerManager *)local_f78);
      if (iVar7 == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1118);
        std::operator<<((ostream *)local_1118,"No tracks selected");
        dstFile_1.field_2._M_local_buf[0xf] = '\x01';
        pVVar19 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar19,3,&local_1138);
        dstFile_1.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(pVVar19,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      pcVar10 = _firstM2tsOffset[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1180,pcVar10,&local_1181);
      unquoteStr((string *)local_1160,&local_1180);
      std::__cxx11::string::~string((string *)&local_1180);
      std::allocator<char>::~allocator(&local_1181);
      bVar5 = isValidFileName((string *)local_1160);
      if (!bVar5) {
        endTime.__d.__r._6_1_ = 1;
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11c8,"Output filename is invalid: ",
                   (allocator<char> *)((long)&endTime.__d.__r + 7));
        std::operator+(&local_11a8,&local_11c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1160);
        std::runtime_error::runtime_error(prVar17,(string *)&local_11a8);
        endTime.__d.__r._6_1_ = 0;
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      createDir((string *)local_1160,true);
      MuxerManager::doMux((MuxerManager *)local_f78,(string *)local_1160,(FileFactory *)0x0);
      poVar9 = std::operator<<((ostream *)&std::cout,"Demux complete.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      std::__cxx11::string::~string((string *)local_1160);
      MuxerManager::~MuxerManager((MuxerManager *)local_f78);
    }
    totalTime.__r = std::chrono::_V2::steady_clock::now();
    seconds.__r = (rep)std::chrono::operator-
                                 ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&totalTime,&stack0xfffffffffffffae8);
    minutes.__r = (rep)std::chrono::
                       duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)&seconds);
    local_11f0.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&seconds);
    if (bVar3) {
      std::operator<<((ostream *)&std::cout,"Muxing time: ");
    }
    else {
      std::operator<<((ostream *)&std::cout,"Demuxing time: ");
    }
    sLastMsg = true;
    rVar23 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_11f0);
    if (0 < rVar23) {
      rVar23 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_11f0);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar23);
      std::operator<<(poVar9," min ");
      sLastMsg = true;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
                ((duration<long,std::ratio<1l,1l>> *)&e_2,&local_11f0);
      std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-=
                ((duration<long,_std::ratio<1L,_1L>_> *)&minutes,
                 (duration<long,_std::ratio<1L,_1L>_> *)&e_2);
    }
    rVar23 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                       ((duration<long,_std::ratio<1L,_1L>_> *)&minutes);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar23);
    poVar9 = std::operator<<(poVar9," sec");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)local_588);
    std::__cxx11::string::~string((string *)local_560);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_538);
    std::__cxx11::string::~string((string *)local_4c8);
  }
  else {
    showHelp();
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
#ifdef _WIN32
    auto argvWide = CommandLineToArgvW(GetCommandLineW(), &argc);
    std::vector<std::string> argv_utf8;
    argv_utf8.reserve(static_cast<std::size_t>(argc));
    for (int i = 0; i < argc; ++i)
    {
        argv_utf8.emplace_back(toUtf8(argvWide[i]));
    }
    LocalFree(argvWide);
    std::vector<char*> argv_vec;
    argv_vec.reserve(argv_utf8.size());
    for (auto&& s : argv_utf8)
    {
        argv_vec.push_back(s.data());
    }
    argv = argv_vec.data();
#endif
    LTRACE(LT_INFO, 2, "tsMuxeR version " TSMUXER_VERSION << ". github.com/justdan96/tsMuxer");
    int firstMplsOffset = 0;
    int firstM2tsOffset = 0;
    int blankNum = 1900;
    bool insertBlankPL = false;
    // createBluRayDirs("c:/workshop/");

    // MPLSParser parser;
    // parser.parse("d:/hdtv/SHERLOCK_HOLMES/BDMV/PLAYLIST/00100.mpls");

    // CLPIParser parser;
    // parser.parse("h:/BDMV/CLIPINF/00000.clpi");
    // parser.parse("d:/workshop/test_orig_disk2/BDMV/CLIPINF/00003.clpi");

    // uint8_t moBuffer[1024];
    // MovieObject mo;
    // mo.parse("h:/BDMV/MovieObject.bdmv");
    // int moLen = mo.compose(moBuffer, sizeof(moBuffer));
    // file.write(moBuffer, moLen);

    try
    {
        if (argc == 2)
        {
            string str = argv[1];
            string fileExt = extractFileExt(str);
            fileExt = strToLowerCase(fileExt);
            if (fileExt == "mpls" || fileExt == "mpl")
            {
                bool shortExt = fileExt == "mpl";
                MPLSParser mplsParser;
                mplsParser.parse(argv[1]);
                string streamDir = getBlurayStreamDir(argv[1]);
                std::string mediaExt = shortExt ? ".MTS" : ".m2ts";
                std::string ssifExt = shortExt ? ".SIF" : ".ssif";
                bool mode3D = mplsParser.isDependStreamExist;
                bool switchToSsif = false;
                if (!mplsParser.m_playItems.empty())
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[0];
                    string itemName = streamDir + item.fileName + mediaExt;
                    if (fileExists(itemName))
                    {
                        if (mode3D && !mplsParser.m_mvcFiles.empty())
                        {
                            string subItemName = streamDir + mplsParser.m_mvcFiles[0] + mediaExt;
                            if (fileExists(subItemName))
                                detectStreamReader(subItemName.c_str(), &mplsParser, true);
                            else
                                switchToSsif = true;
                        }
                    }
                    else
                    {
                        switchToSsif = true;
                    }
                    if (switchToSsif)
                    {
                        string ssifName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ssifExt;
                        if (fileExists(ssifName))
                            itemName = ssifName;  // if m2ts file absent then swith to ssif
                    }
                    detectStreamReader(itemName.c_str(), &mplsParser, false);
                }

                size_t markIndex = 0;
                int64_t prevFileOffset = 0;
                for (size_t i = 0; i < mplsParser.m_playItems.size(); i++)
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[i];

                    string itemName;
                    if (mode3D)
                        itemName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ".ssif";
                    else
                        itemName = streamDir.append(item.fileName).append(mediaExt);  // 2d mode

                    LTRACE(LT_INFO, 2, "");
                    LTRACE(LT_INFO, 2, "File #" << strPadLeft(int64ToStr(i), 5, '0') << " name=" << itemName);
                    LTRACE(LT_INFO, 2,
                           "Duration: " << floatToTime(
                               (mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time) /
                               (double)45000.0));
                    if (mplsParser.isDependStreamExist)
                    {
                        if (mplsParser.mvc_base_view_r)
                        {
                            LTRACE(LT_INFO, 2, "Base view: right-eye");
                        }
                        else
                        {
                            LTRACE(LT_INFO, 2, "Base view: left-eye");
                        }
                    }
                    if (!mplsParser.m_playItems.empty())
                        LTRACE(LT_INFO, 2, "start-time: " << mplsParser.m_playItems[0].IN_time);
                    int marksPerFile = 0;
                    for (; markIndex < mplsParser.m_marks.size(); markIndex++)
                    {
                        PlayListMark& curMark = mplsParser.m_marks[markIndex];
                        if (static_cast<unsigned>(curMark.m_playItemID) > i)
                            break;
                        uint64_t time = curMark.m_markTime - mplsParser.m_playItems[i].IN_time + prevFileOffset;
                        if (marksPerFile % 5 == 0)
                        {
                            if (marksPerFile > 0)
                                LTRACE(LT_INFO, 2, "");
                            LTRACE2(LT_INFO, "Marks: ")
                        }
                        marksPerFile++;
                        LTRACE2(LT_INFO, floatToTime((double)time / 45000.0) << " ")
                    }
                    if (marksPerFile > 0)
                        LTRACE(LT_INFO, 2, "");
                    prevFileOffset += mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time;
                }
            }
            else
                detectStreamReader(argv[1], nullptr, false);
            cout << endl;
            return 0;
        }
        if (argc != 3)
        {
            /*
                        LTRACE(LT_INFO, 2, "Usage: ");
                        LTRACE(LT_INFO, 2, "For start muxing: " << "tsMuxeR <meta file name> <out file/dir name>");
                        LTRACE(LT_INFO, 2, "For detect stream params: " << "tsMuxeR <media file name>");
                        LTRACE(LT_INFO, 2, "For more information about meta file see readme.txt");
                        cout << endl;
            */
            showHelp();
            return -1;
        }
        string fileExt = extractFileExt(argv[2]);
        fileExt = strToUpperCase(fileExt);
        auto startTime = std::chrono::steady_clock::now();

        int autoChapterLen = 0;
        vector<double> customChapterList;
        bool stereoMode = false;
        string isoDiskLabel;
        DiskType dt = checkBluRayMux(argv[1], autoChapterLen, customChapterList, firstMplsOffset, firstM2tsOffset,
                                     insertBlankPL, blankNum, stereoMode, isoDiskLabel);
        std::string fileExt2 = unquoteStr(fileExt);
        bool muxMode =
            fileExt2 == "M2TS" || fileExt2 == "TS" || fileExt2 == "SSIF" || fileExt2 == "ISO" || dt != DiskType::NONE;

        if (muxMode)
        {
            BlurayHelper blurayHelper;

            MuxerManager muxerManager(readManager, tsMuxerFactory);
            muxerManager.setAllowStereoMux(fileExt2 == "SSIF" || dt != DiskType::NONE);
            muxerManager.openMetaFile(argv[1]);
            if (!isV3() && dt == DiskType::BLURAY && muxerManager.getHevcFound())
            {
                LTRACE(LT_INFO, 2, "HEVC stream detected: changing Blu-Ray version to V3.");
                V3_flags |= HDMV_V3;
            }

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            if (dt != DiskType::NONE)
            {
                if (!blurayHelper.open(dstFile, dt, muxerManager.totalSize(), muxerManager.getExtraISOBlocks(),
                                       muxerManager.useReproducibleIsoHeader()))
                    throw runtime_error(string("Can't create output file ") + dstFile);
                blurayHelper.setVolumeLabel(isoDiskLabel);
                blurayHelper.createBluRayDirs();
                dstFile = blurayHelper.m2tsFileName(firstM2tsOffset);
            }
            if (muxerManager.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")
            muxerManager.doMux(dstFile, dt != DiskType::NONE ? &blurayHelper : nullptr);
            if (dt != DiskType::NONE)
            {
                blurayHelper.writeBluRayFiles(muxerManager, insertBlankPL, firstMplsOffset, blankNum, stereoMode);
                auto mainMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());
                auto subMuxer = dynamic_cast<TSMuxer*>(muxerManager.getSubMuxer());

                if (mainMuxer)
                    blurayHelper.createCLPIFile(mainMuxer, mainMuxer->getFirstFileNum(), true);
                if (subMuxer)
                {
                    blurayHelper.createCLPIFile(subMuxer, subMuxer->getFirstFileNum(), false);

                    IsoWriter* IsoWriter = blurayHelper.isoWriter();
                    if (IsoWriter)
                    {
                        for (size_t i = 0; i < mainMuxer->splitFileCnt(); ++i)
                        {
                            string file1 = mainMuxer->getFileNameByIdx(i);
                            string file2 = subMuxer->getFileNameByIdx(i);
                            int ssifNum = strToInt32(extractFileName(file1));
                            if (!file1.empty() && !file2.empty())
                                IsoWriter->createInterleavedFile(file1, file2, blurayHelper.ssifFileName(ssifNum));
                        }
                    }
                }

                for (auto& i : customChapterList)
                    i -= static_cast<double>(muxerManager.getCutStart()) / INTERNAL_PTS_FREQ;

                if (subMuxer)
                    mainMuxer->alignPTS(subMuxer);

                blurayHelper.createMPLSFile(mainMuxer, subMuxer, autoChapterLen, customChapterList, dt, firstMplsOffset,
                                            muxerManager.isMvcBaseViewR());

                if (insertBlankPL && mainMuxer && !subMuxer)
                {
                    LTRACE(LT_INFO, 2, "Adding blank play list");
                    muxBlankPL(extractFileDir(argv[0]), blurayHelper, mainMuxer->getPidList(), dt, blankNum);
                }
            }

            LTRACE(LT_INFO, 2, "Mux successful complete");
        }
        else
        {
            MuxerManager sMuxer(readManager, singleFileMuxerFactory);
            sMuxer.openMetaFile(argv[1]);
            if (sMuxer.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            createDir(dstFile, true);
            sMuxer.doMux(dstFile, nullptr);
            LTRACE(LT_INFO, 2, "Demux complete.");
        }
        auto endTime = std::chrono::steady_clock::now();
        auto totalTime = endTime - startTime;
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(totalTime);
        auto minutes = std::chrono::duration_cast<std::chrono::minutes>(totalTime);
        if (muxMode)
        {
            LTRACE2(LT_INFO, "Muxing time: ")
        }
        else
            LTRACE2(LT_INFO, "Demuxing time: ")
        if (minutes.count() > 0)
        {
            LTRACE2(LT_INFO, minutes.count() << " min ")
            seconds -= minutes;
        }
        LTRACE(LT_INFO, 2, seconds.count() << " sec");

        return 0;
    }
    catch (runtime_error& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE2(LT_ERROR, e.what())
        return -1;
    }
    catch (VodCoreException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, e.m_errStr.c_str());
        return -2;
    }
    catch (BitStreamException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Bitstream exception " << e.what() << EXCEPTION_ERR_MSG);
        return -3;
    }
    catch (...)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Unknnown exception" << EXCEPTION_ERR_MSG);
        return -4;
    }
}